

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::mlFg_Update(HModel *this,int mlFg_action)

{
  uint in_ESI;
  HModel *in_RDI;
  int in_stack_0000007c;
  HModel *in_stack_00000080;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == in_RDI->mlFg_action_TransposeLP) {
    mlFg_Clear(in_RDI);
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_transposedLP = 1;
  }
  else if (in_ESI == in_RDI->mlFg_action_ScaleLP) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_scaledLP = 1;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
    populate_WorkArrays((HModel *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  else if (in_ESI == in_RDI->mlFg_action_ShuffleLP) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_shuffledLP = 1;
    in_RDI->mlFg_haveBasis = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_NewBounds) {
    in_RDI->problemStatus = -1;
    initBound(this,mlFg_action);
    initValue((HModel *)0x1751b4);
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_NewCosts) {
    in_RDI->problemStatus = -1;
    initCost(in_stack_00000080,in_stack_0000007c);
    in_RDI->mlFg_haveNonbasicDuals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_NewBasis) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 1;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_NewCols) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 1;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_NewRows) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 1;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_DelCols) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 0;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_DelRows) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 0;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else if (in_ESI == in_RDI->mlFg_action_DelRowsBasisOK) {
    in_RDI->problemStatus = -1;
    in_RDI->mlFg_haveBasis = 1;
    in_RDI->mlFg_haveMatrixColWise = 0;
    in_RDI->mlFg_haveMatrixRowWise = 0;
    in_RDI->mlFg_haveFactorArrays = 0;
    in_RDI->mlFg_haveEdWt = 0;
    in_RDI->mlFg_haveInvert = 0;
    in_RDI->mlFg_haveFreshInvert = 0;
    in_RDI->mlFg_haveBasicPrimals = 0;
    in_RDI->mlFg_haveNonbasicDuals = 0;
    in_RDI->mlFg_haveFreshRebuild = 0;
  }
  else {
    printf("Unrecognised mlFg_action = %d\n",(ulong)in_ESI);
  }
  return;
}

Assistant:

void HModel::mlFg_Update(int mlFg_action) {
  //  switch(mlFg_action) {
  if (mlFg_action == mlFg_action_TransposeLP) {
    //The LP has just been transposed
    //Want to clear all flags since model is totally different
    //Should not clear flags if model is scaled
    assert(mlFg_scaledLP = 0);
    //Clear the model flags, but indicate that it's transposed
    mlFg_Clear();
    problemStatus = LP_Status_Unset;
    mlFg_transposedLP = 1;
  }
  else if (mlFg_action == mlFg_action_ScaleLP) {
    //The LP has just been scaled
    problemStatus = LP_Status_Unset;
    mlFg_scaledLP = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveFreshRebuild = 0;

    populate_WorkArrays();
    
  }
  else if (mlFg_action == mlFg_action_ShuffleLP) {
    //The LP has been shuffled
    //Indicate that the columns have been shuffled
    problemStatus = LP_Status_Unset;
    mlFg_shuffledLP = 1;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewBounds) {
    //New bounds have been defined
    problemStatus = LP_Status_Unset;
    initBound();
    initValue();
    mlFg_haveBasicPrimals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewCosts) {
    //New costs have been defined
    problemStatus = LP_Status_Unset;
    initCost();
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewBasis) {
    //A new basis has been defined
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_NewCols) {
    //New columns have been added as nonbasic
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
  }
  else if (mlFg_action == mlFg_action_NewRows) {
    //New rows have been added as basic
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_DelCols) {
    //Columns have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
  }
  else if (mlFg_action == mlFg_action_DelRows) {
    //Rows have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 0;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else if (mlFg_action == mlFg_action_DelRowsBasisOK) {
    //Rows have been deleted
    problemStatus = LP_Status_Unset;
    mlFg_haveBasis = 1;
    mlFg_haveMatrixColWise = 0;
    mlFg_haveMatrixRowWise = 0;
    mlFg_haveFactorArrays = 0;
    mlFg_haveEdWt = 0;
    mlFg_haveInvert = 0;
    mlFg_haveFreshInvert = 0;
    mlFg_haveBasicPrimals = 0;
    mlFg_haveNonbasicDuals = 0;
    mlFg_haveFreshRebuild = 0;
  }
  else {
    printf("Unrecognised mlFg_action = %d\n", mlFg_action);
  }
}